

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> * __thiscall
covenant::CFG::computeGenerating
          (set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
           *__return_storage_ptr__,CFG *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pvVar3;
  _Base_ptr p_Var4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  pointer pPVar10;
  size_type sVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  _Rb_tree_header *p_Var17;
  bool bVar18;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  Sym local_64;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_60;
  ulong local_48;
  CFG *local_40;
  long local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = this;
  do {
    if ((this->prods).
        super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->prods).
        super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      return __return_storage_ptr__;
    }
    local_48 = 0;
    bVar9 = false;
    do {
      pvVar3 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = local_48 * 3;
      pPVar10 = pvVar3[local_48].
                super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar3[local_48].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data + 8) != pPVar10) {
        iVar5 = (int)local_48;
        iVar6 = iVar5 * 2;
        iVar14 = iVar5 * 2 + 1;
        uVar13 = 0;
        do {
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    (&local_60,
                     (this->rules).
                     super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pPVar10[uVar13].rule);
          if (local_60.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_60.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start) {
LAB_0014fd8d:
            p_Var4 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var12 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[iVar2 == iVar6 || SBORROW4(iVar2,iVar6) != bVar18]) {
              iVar2 = (int)*(size_t *)(p_Var4 + 1);
              bVar18 = iVar2 + iVar5 * -2 < 0;
              if (iVar2 != iVar6 && SBORROW4(iVar2,iVar6) == bVar18) {
                p_Var12 = p_Var4;
              }
            }
            p_Var17 = p_Var1;
            if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
               (p_Var17 = (_Rb_tree_header *)p_Var12,
               iVar14 < (int)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
              p_Var17 = p_Var1;
            }
            local_64.x = iVar14;
            if (p_Var17 == p_Var1) {
              std::
              _Rb_tree<covenant::Sym,covenant::Sym,std::_Identity<covenant::Sym>,std::less<covenant::Sym>,std::allocator<covenant::Sym>>
              ::_M_insert_unique<covenant::Sym_const&>
                        ((_Rb_tree<covenant::Sym,covenant::Sym,std::_Identity<covenant::Sym>,std::less<covenant::Sym>,std::allocator<covenant::Sym>>
                          *)__return_storage_ptr__,&local_64);
            }
            bVar9 = (bool)(bVar9 | p_Var17 == p_Var1);
          }
          else {
            bVar18 = true;
            uVar15 = 0;
            uVar16 = 1;
            bVar8 = true;
            do {
              bVar7 = bVar8;
              if ((local_60.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].x & 1) != 0) {
                sVar11 = std::
                         set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
                         ::count(__return_storage_ptr__,
                                 local_60.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar15);
                bVar18 = false;
                bVar7 = false;
                if (sVar11 != 0) {
                  bVar18 = bVar8;
                  bVar7 = bVar8;
                }
              }
            } while ((uVar16 < (ulong)((long)local_60.
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_60.
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 2)) &&
                    (uVar15 = uVar16, uVar16 = (ulong)((int)uVar16 + 1), bVar8 = bVar7, bVar18));
            this = local_40;
            if (bVar18) goto LAB_0014fd8d;
          }
          if (local_60.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.
                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pvVar3 = (this->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar10 = *(pointer *)
                     ((long)&(pvVar3->
                             super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                             )._M_impl.super__Vector_impl_data + local_38 * 8);
        } while (uVar13 < (ulong)(*(long *)((long)&(pvVar3->
                                                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                  )._M_impl.super__Vector_impl_data +
                                           local_38 * 8 + 8) - (long)pPVar10 >> 2));
      }
      local_48 = (ulong)((int)local_48 + 1);
      uVar13 = ((long)(this->prods).
                      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->prods).
                      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (local_48 <= uVar13 && uVar13 - local_48 != 0);
    if (!bVar9) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

set<Sym> computeGenerating()
    {
      set<Sym> GenSet;
      bool change=true;
      while (change)
      {
        change = false;
        for ( unsigned int vv = 0; vv < prods.size(); vv++ )
        {
          for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
          {
            const int r = prods[vv][ri].rule;
            vector<Sym> RHS = rules[r];
            bool allSatisfy=true;
            for(unsigned si =0; (si < RHS.size() && allSatisfy) ; si++)
            {
              if (!(RHS[si].isTerm() || GenSet.count(RHS[si]) > 0))
                allSatisfy=false;
            }
            if (allSatisfy)
              change |= InsertAndNotifyChange(GenSet,Sym::mkVar(vv));
          }
        }
      }
      return GenSet;
    }